

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (CompilerMSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,string *qualifier
          )

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *type_00;
  char *pcVar3;
  CompilerError *pCVar4;
  undefined4 in_register_00000014;
  SPIRType *type_01;
  uint32_t index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined1 local_4b8 [32];
  undefined1 local_498 [71];
  char local_451;
  string local_450 [36];
  BuiltIn local_42c;
  string local_428 [4];
  BuiltIn builtin;
  string array_type;
  allocator local_401;
  string local_400 [36];
  ID local_3dc;
  __cxx11 local_3d8 [32];
  string local_3b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398 [32];
  __cxx11 local_378 [32];
  __cxx11 local_358 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  string local_2d8 [32];
  __cxx11 local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [39];
  allocator local_251;
  string local_250 [8];
  string td_line;
  allocator local_229;
  string local_228 [8];
  string base_type;
  uint local_204;
  uint local_200;
  uint32_t cols;
  uint32_t rows;
  uint32_t local_1d4;
  SPIRType *local_1d0;
  SPIRType *declared_type;
  SPIRType row_major_physical_type;
  bool local_6d;
  bool row_major;
  uint32_t local_5c;
  string local_58 [4];
  uint32_t orig_id;
  string pack_pfx;
  SPIRType *physical_type;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *result;
  
  type_01 = (SPIRType *)CONCAT44(in_register_00000014,member_type_id);
  index_00 = (uint32_t)qualifier;
  bVar1 = CompilerGLSL::member_is_remapped_physical_type((CompilerGLSL *)type,type_01,index_00);
  qualifier_local._4_4_ = index;
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
    qualifier_local._4_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationPhysicalTypeID);
  }
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,qualifier_local._4_4_);
  ::std::__cxx11::string::string(local_58);
  local_5c = 0;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationInterfaceOrigID);
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
    local_5c = Compiler::get_extended_member_decoration
                         ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationInterfaceOrigID);
  }
  local_6d = false;
  bVar1 = Compiler::is_matrix((Compiler *)type,type_00);
  if (bVar1) {
    row_major_physical_type.member_name_cache._M_h._M_single_bucket._4_4_ =
         TypedID::operator_cast_to_TypedID((TypedID *)&(type_01->super_IVariant).self);
    local_6d = Compiler::has_member_decoration
                         ((Compiler *)type,
                          (TypeID)row_major_physical_type.member_name_cache._M_h._M_single_bucket.
                                  _4_4_,index_00,DecorationRowMajor);
  }
  SPIRType::SPIRType((SPIRType *)&declared_type);
  local_1d0 = type_00;
  local_1d4 = (uint32_t)
              TypedID::operator_cast_to_TypedID((TypedID *)&(type_01->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)type,(TypeID)local_1d4,index_00,DecorationOffset);
  if (bVar1) {
    *(undefined1 *)((long)&type[0x1d].member_name_cache._M_h._M_bucket_count + 6) = 1;
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
    bVar1 = Compiler::has_extended_member_decoration
                      ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationResourceIndexPrimary);
    if (bVar1) {
      *(undefined1 *)((long)&type[0x1d].member_name_cache._M_h._M_bucket_count + 6) = 1;
    }
  }
  bVar1 = CompilerGLSL::member_is_packed_physical_type((CompilerGLSL *)type,type_01,index_00);
  if (bVar1) {
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      cols._2_1_ = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&rows,"Cannot emit a packed struct currently.",
                 (allocator *)((long)&cols + 3));
      CompilerError::CompilerError(pCVar4,(string *)&rows);
      cols._2_1_ = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar1 = Compiler::is_matrix((Compiler *)type,type_00);
    if (bVar1) {
      local_200 = type_00->vecsize;
      local_204 = type_00->columns;
      ::std::__cxx11::string::operator=(local_58,"packed_");
      if (local_6d != false) {
        local_200 = type_00->columns;
        local_204 = type_00->vecsize;
        ::std::__cxx11::string::operator=(local_58,"packed_rm_");
      }
      pcVar3 = "float";
      if (type_00->width == 0x10) {
        pcVar3 = "half";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_228,pcVar3,&local_229);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_229);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_250,"typedef ",&local_251);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
      ::std::operator+((char *)local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "packed_");
      ::std::__cxx11::to_string(local_2b8,local_200);
      ::std::operator+(local_278,local_298);
      ::std::__cxx11::string::operator+=(local_250,(string *)local_278);
      ::std::__cxx11::string::~string((string *)local_278);
      ::std::__cxx11::string::~string((string *)local_2b8);
      ::std::__cxx11::string::~string((string *)local_298);
      ::std::operator+((char *)local_2d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e078e
                      );
      ::std::__cxx11::string::operator+=(local_250,local_2d8);
      ::std::__cxx11::string::~string(local_2d8);
      ::std::__cxx11::to_string(local_358,type_00->columns);
      ::std::operator+(local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228);
      ::std::operator+(local_318,(char *)local_338);
      ::std::__cxx11::to_string(local_378,type_00->vecsize);
      ::std::operator+(local_2f8,local_318);
      ::std::__cxx11::string::operator+=(local_250,(string *)local_2f8);
      ::std::__cxx11::string::~string((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)local_378);
      ::std::__cxx11::string::~string((string *)local_318);
      ::std::__cxx11::string::~string((string *)local_338);
      ::std::__cxx11::string::~string((string *)local_358);
      ::std::__cxx11::to_string(local_3d8,local_204);
      ::std::operator+((char *)local_3b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f1699
                      );
      ::std::operator+(local_398,(char *)local_3b8);
      ::std::__cxx11::string::operator+=(local_250,(string *)local_398);
      ::std::__cxx11::string::~string((string *)local_398);
      ::std::__cxx11::string::~string(local_3b8);
      ::std::__cxx11::string::~string((string *)local_3d8);
      ::std::__cxx11::string::operator+=(local_250,";");
      add_typedef_line((CompilerMSL *)type,(string *)local_250);
      ::std::__cxx11::string::~string(local_250);
      ::std::__cxx11::string::~string(local_228);
    }
    else {
      bVar1 = Compiler::is_scalar((Compiler *)type,type_00);
      if (!bVar1) {
        ::std::__cxx11::string::operator=(local_58,"packed_");
      }
    }
  }
  else if (local_6d != false) {
    SPIRType::operator=((SPIRType *)&declared_type,type_00);
    ::std::swap<unsigned_int>
              ((uint *)&row_major_physical_type.super_IVariant.field_0xc,
               &row_major_physical_type.width);
    local_1d0 = (SPIRType *)&declared_type;
  }
  bVar1 = Options::is_ios((Options *)&type[0x1b].member_name_cache._M_h._M_rehash_policy.field_0x4);
  if (((bVar1) && (*(int *)&(type_00->super_IVariant).field_0xc == 0x10)) &&
     ((type_00->image).sampled == 2)) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_3dc,local_5c);
    bVar1 = Compiler::has_decoration((Compiler *)type,local_3dc,DecorationNonWritable);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_400,"Writable images are not allowed in argument buffers on iOS.",&local_401)
      ;
      CompilerError::CompilerError(pCVar4,(string *)local_400);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
  ::std::__cxx11::string::string(local_428);
  if (((*(int *)&(type_00->super_IVariant).field_0xc != 0x10) &&
      (*(int *)&(type_00->super_IVariant).field_0xc != 0x12)) &&
     (*(int *)&(type_00->super_IVariant).field_0xc != 0x11)) {
    local_42c = BuiltInMax;
    bVar1 = Compiler::is_member_builtin((Compiler *)type,type_01,index_00,&local_42c);
    if (bVar1) {
      *(undefined1 *)((long)&type[0x1d].member_name_cache._M_h._M_bucket_count + 6) = 1;
    }
    (*(type->super_IVariant)._vptr_IVariant[0x23])(local_450,type,type_00);
    ::std::__cxx11::string::operator=(local_428,local_450);
    ::std::__cxx11::string::~string(local_450);
  }
  local_451 = '\0';
  (*(type->super_IVariant)._vptr_IVariant[0x13])(local_498 + 0x20,type,local_1d0,(ulong)local_5c);
  CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_498,type,member_type_id);
  member_attribute_qualifier_abi_cxx11_((CompilerMSL *)local_4b8,type,member_type_id);
  join<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            ((spirv_cross *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_498 + 0x20)
             ,(char (*) [2])0x4e078e,in_R9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
             (char (*) [2])0x4d9ce2);
  ::std::__cxx11::string::~string((string *)local_4b8);
  ::std::__cxx11::string::~string((string *)local_498);
  ::std::__cxx11::string::~string((string *)(local_498 + 0x20));
  *(undefined1 *)((long)&type[0x1d].member_name_cache._M_h._M_bucket_count + 6) = 0;
  local_451 = '\x01';
  ::std::__cxx11::string::~string(local_428);
  SPIRType::~SPIRType((SPIRType *)&declared_type);
  ::std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type;
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (row_major)
	{
		// Need to declare type with flipped vecsize/columns.
		row_major_physical_type = physical_type;
		swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
		declared_type = &row_major_physical_type;
	}

	// Very specifically, image load-store in argument buffers are disallowed on MSL on iOS.
	if (msl_options.is_ios() && physical_type.basetype == SPIRType::Image && physical_type.image.sampled == 2)
	{
		if (!has_decoration(orig_id, DecorationNonWritable))
			SPIRV_CROSS_THROW("Writable images are not allowed in argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;
		if (is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type);
	}

	auto result = join(pack_pfx, type_to_glsl(*declared_type, orig_id), " ", qualifier, to_member_name(type, index),
	                   member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}